

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O0

void __thiscall Device::readChipId(Device *this,uint32_t *chipId,uint32_t *extChipId)

{
  uint32_t uVar1;
  uint32_t *extChipId_local;
  uint32_t *chipId_local;
  Device *this_local;
  
  uVar1 = Samba::readWord(this->_samba,0x400e0740);
  *chipId = uVar1;
  if (uVar1 == 0) {
    uVar1 = Samba::readWord(this->_samba,0x400e0940);
    *chipId = uVar1;
    if (uVar1 == 0) {
      uVar1 = Samba::readWord(this->_samba,0x6000f000);
      *chipId = uVar1;
      if (uVar1 != 0) {
        uVar1 = Samba::readWord(this->_samba,0x6000f004);
        *extChipId = uVar1;
      }
    }
    else {
      uVar1 = Samba::readWord(this->_samba,0x400e0944);
      *extChipId = uVar1;
    }
  }
  else {
    uVar1 = Samba::readWord(this->_samba,0x400e0744);
    *extChipId = uVar1;
  }
  return;
}

Assistant:

void
Device::readChipId(uint32_t& chipId, uint32_t& extChipId)
{
    if ((chipId = _samba.readWord(0x400e0740)) != 0)
    {
        extChipId = _samba.readWord(0x400e0744);
    }
    else if ((chipId = _samba.readWord(0x400e0940)) != 0)
    {
        extChipId = _samba.readWord(0x400e0944);
    }else if((chipId = _samba.readWord(0x6000F000)) != 0)
    {
        extChipId = _samba.readWord(0x6000F004);
    }

    
}